

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDLGraphicsSystemTests.cpp
# Opt level: O1

void __thiscall
solitaire::graphics::
SDLGraphicsSystemWithLoadedTexture_throwIfSDLRenderClearFailedDuringFrameRendering_Test::TestBody
          (SDLGraphicsSystemWithLoadedTexture_throwIfSDLRenderClearFailedDuringFrameRendering_Test
           *this)

{
  int iVar1;
  WrapperMock *pWVar2;
  bool bVar3;
  TypedExpectation<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&)>
  *this_00;
  ActionInterface<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&)>
  *impl;
  TrueWithString gtest_msg;
  undefined1 local_98 [24];
  Buffer BStack_80;
  _Any_data local_70;
  code *local_60;
  MatcherBase<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&> local_50
  ;
  int *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  undefined8 local_28;
  
  pWVar2 = &((this->super_SDLGraphicsSystemWithLoadedTexture).
             super_SDLGraphicsSystemWithCreatedWindowTests.super_SDLGraphicsSystemTests.sdlMock.
            rawPointer)->super_WrapperMock;
  local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface = (_func_int **)0x2;
  testing::internal::PointerMatcher::operator_cast_to_Matcher
            ((Matcher<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&>
              *)&local_70,(PointerMatcher *)&local_50);
  SDL::WrapperMock::gmock_renderPresent
            ((MockSpec<void_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&)>
              *)local_98,pWVar2,
             (Matcher<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&>
              *)&local_70);
  testing::internal::GetWithoutMatchers();
  testing::internal::
  MockSpec<void_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&)>::
  InternalExpectedAt((MockSpec<void_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&)>
                      *)local_98,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/graphics/SDLGraphicsSystemTests.cpp"
                     ,0x193,"*sdlMock","renderPresent(Pointer(rendererPtr))");
  testing::internal::
  MatcherBase<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&>::
  ~MatcherBase((MatcherBase<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&>
                *)(local_98 + 8));
  testing::internal::
  MatcherBase<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&>::
  ~MatcherBase((MatcherBase<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&>
                *)&local_70);
  pWVar2 = &((this->super_SDLGraphicsSystemWithLoadedTexture).
             super_SDLGraphicsSystemWithCreatedWindowTests.super_SDLGraphicsSystemTests.sdlMock.
            rawPointer)->super_WrapperMock;
  local_28 = 2;
  testing::internal::PointerMatcher::operator_cast_to_Matcher
            ((Matcher<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&>
              *)&local_50,(PointerMatcher *)&local_28);
  SDL::WrapperMock::gmock_renderClear
            ((MockSpec<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&)>
              *)local_98,pWVar2,
             (Matcher<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&>
              *)&local_50);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::
            MockSpec<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&)>
            ::InternalExpectedAt
                      ((MockSpec<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&)>
                        *)local_98,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/graphics/SDLGraphicsSystemTests.cpp"
                       ,0x194,"*sdlMock","renderClear(Pointer(rendererPtr))");
  local_38 = (int *)operator_new(4);
  *local_38 = -1;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<int*>(&local_30,local_38);
  impl = (ActionInterface<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&)>
          *)operator_new(0x10);
  impl->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_00330940;
  iVar1 = *local_38;
  *(int *)&impl[1]._vptr_ActionInterface = iVar1;
  *(int *)((long)&impl[1]._vptr_ActionInterface + 4) = iVar1;
  testing::
  Action<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&)>::Action
            ((Action<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&)>
              *)&local_70,impl);
  testing::internal::
  TypedExpectation<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&)>
  ::WillOnce(this_00,(Action<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&)>
                      *)&local_70);
  if (local_60 != (code *)0x0) {
    (*local_60)(&local_70,&local_70,3);
  }
  if (local_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30._M_pi);
  }
  testing::internal::
  MatcherBase<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&>::
  ~MatcherBase((MatcherBase<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&>
                *)(local_98 + 8));
  testing::internal::
  MatcherBase<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&>::
  ~MatcherBase(&local_50);
  BStack_80.ptr = (void *)0x0;
  local_98._8_8_ = (_func_int **)0x0;
  local_98._16_8_ = (VTable *)0x0;
  local_98._0_8_ =
       (FunctionMocker<void_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&)>
        *)(local_98 + 0x10);
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    SDLGraphicsSystem::renderFrame
              (&(this->super_SDLGraphicsSystemWithLoadedTexture).
                super_SDLGraphicsSystemWithCreatedWindowTests.super_SDLGraphicsSystemTests.system);
  }
  std::__cxx11::string::_M_replace((ulong)local_98,0,(char *)local_98._8_8_,0x28f800);
  testing::Message::Message((Message *)&local_70);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_50,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/graphics/SDLGraphicsSystemTests.cpp"
             ,0x195,(char *)local_98._0_8_);
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_50,(Message *)&local_70);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_50);
  if ((long *)local_70._M_unused._0_8_ != (long *)0x0) {
    (**(code **)(*local_70._M_unused._M_object + 8))();
  }
  if ((FunctionMocker<void_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&)>
       *)local_98._0_8_ !=
      (FunctionMocker<void_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&)>
       *)(local_98 + 0x10)) {
    operator_delete((void *)local_98._0_8_,
                    (ulong)((long)(_func_bool_MatcherBase<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_ptr)>_>_&>_ptr_unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_ptr)>_>_ptr_MatchResultListener_ptr
                                   **)local_98._16_8_ + 1));
  }
  SDLGraphicsSystemWithLoadedTexture::expectQuitSystemWithLoadedTexture
            (&this->super_SDLGraphicsSystemWithLoadedTexture);
  return;
}

Assistant:

TEST_F(SDLGraphicsSystemWithLoadedTexture,
       throwIfSDLRenderClearFailedDuringFrameRendering)
{
    EXPECT_CALL(*sdlMock, renderPresent(Pointer(rendererPtr)));
    EXPECT_CALL(*sdlMock, renderClear(Pointer(rendererPtr))).WillOnce(Return(failure));
    EXPECT_THROW(system.renderFrame(), std::runtime_error);
    expectQuitSystemWithLoadedTexture();
}